

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::SooRep::set_non_soo
          (SooRep *this,bool was_soo,int capacity,void *elements)

{
  int iVar1;
  bool *v1;
  bool *v2;
  char *pcVar2;
  LogMessage *pLVar3;
  void **v1_00;
  void **v2_00;
  LogMessage local_a8;
  Voidify local_91;
  unsigned_long local_90;
  unsigned_long local_88;
  Nullable<const_char_*> local_80;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  Voidify local_61;
  void *local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_40;
  Voidify local_2a;
  bool local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  void *elements_local;
  int capacity_local;
  bool was_soo_local;
  SooRep *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)elements;
  elements_local._0_4_ = capacity;
  elements_local._7_1_ = was_soo;
  _capacity_local = this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>
                 ((bool *)((long)&elements_local + 7));
  local_29 = is_soo(this);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_29);
  local_28 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>(v1,v2,"was_soo == is_soo()");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0xdd,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_2a,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  v1_00 = absl::lts_20250127::log_internal::GetReferenceableValue<void*>
                    (&absl_log_internal_check_op_result);
  local_60 = (void *)0x0;
  v2_00 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_60);
  local_58 = absl::lts_20250127::log_internal::Check_NEImpl<void*,decltype(nullptr)>
                       (v1_00,v2_00,"elements != nullptr");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0xde,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_2);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2);
  }
  local_88 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((ulong)absl_log_internal_check_op_result & 7);
  local_90 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_80 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                       (&local_88,&local_90,
                        "reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment == uintptr_t{0}");
  if (local_80 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_80);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0xe0,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a8);
  }
  if ((elements_local._7_1_ & 1) != 0) {
    iVar1 = ShortSooRep::size((ShortSooRep *)this);
    (this->field_0).long_rep.size = iVar1;
  }
  (this->field_0).long_rep.capacity = (int)elements_local;
  (this->field_0).long_rep.elements_int = (ulong)absl_log_internal_check_op_result | 4;
  return;
}

Assistant:

void set_non_soo(bool was_soo, int capacity, void* elements) {
    ABSL_DCHECK_EQ(was_soo, is_soo());
    ABSL_DCHECK_NE(elements, nullptr);
    ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment,
                   uintptr_t{0});
    if (was_soo) long_rep.size = short_rep.size();
    long_rep.capacity = capacity;
    long_rep.elements_int = reinterpret_cast<uintptr_t>(elements) | kNotSooBit;
  }